

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::qdxt1::create_selector_clusters
          (qdxt1 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  uint min_new_capacity;
  bool bVar1;
  uint y;
  uint uVar2;
  long lVar3;
  int iVar4;
  float *pfVar5;
  uint uVar6;
  ulong uVar7;
  dxt1_block *pdVar8;
  color_quad_u8 second_color;
  color_quad_u8 first_color;
  weighted_selector_vec_array selector_vecs;
  vec16F sv;
  undefined1 local_94 [5];
  byte local_8f;
  byte local_8e;
  uint local_8c;
  weighted_vec_array local_88;
  vector<crnlib::vector<unsigned_int>_> *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this->m_progress_start = this->m_progress_range;
  this->m_progress_range = 0x21;
  min_new_capacity = this->m_num_blocks;
  local_88.m_p = (weighted_vec *)0x0;
  local_88.m_size = 0;
  local_88.m_capacity = 0;
  local_8c = max_selector_clusters;
  local_78 = selector_cluster_indices;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_88,min_new_capacity,min_new_capacity == 1,0x44,
               vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
               object_mover,false);
    local_88.m_size = min_new_capacity;
  }
  if (this->m_num_blocks != 0) {
    uVar7 = 0;
    do {
      pdVar8 = this->m_pDst_elements + this->m_elements_per_block * (int)uVar7;
      lVar3 = 0;
      pfVar5 = (float *)&local_70;
      do {
        iVar4 = 0;
        do {
          *pfVar5 = (float)(byte)(&g_dxt1_to_linear)
                                 [pdVar8->m_selectors[lVar3] >> ((byte)iVar4 & 0x1f) & 3];
          pfVar5 = pfVar5 + 1;
          iVar4 = iVar4 + 2;
        } while (iVar4 != 8);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      dxt1_block::unpack_color
                ((dxt1_block *)(local_94 + 4),*(uint16 *)pdVar8->m_low_color,true,0xff);
      dxt1_block::unpack_color((dxt1_block *)local_94,*(uint16 *)pdVar8->m_high_color,true,0xff);
      iVar4 = (uint)local_94[4] - (uint)local_94[0];
      if ((this->m_params).m_perceptual == true) {
        uVar2 = ((uint)local_8e - (uint)local_94[2]) * ((uint)local_8e - (uint)local_94[2]) +
                ((uint)local_8f - (uint)local_94[1]) * ((uint)local_8f - (uint)local_94[1]) * 0x19 +
                iVar4 * iVar4 * 8;
      }
      else {
        uVar2 = ((uint)local_8e - (uint)local_94[2]) * ((uint)local_8e - (uint)local_94[2]) +
                ((uint)local_8f - (uint)local_94[1]) * ((uint)local_8f - (uint)local_94[1]) +
                iVar4 * iVar4;
      }
      pfVar5 = local_88.m_p[uVar7].m_vec.m_s + 0xc;
      *(undefined8 *)pfVar5 = local_40;
      *(undefined8 *)(pfVar5 + 2) = uStack_38;
      pfVar5 = local_88.m_p[uVar7].m_vec.m_s + 8;
      *(undefined8 *)pfVar5 = local_50;
      *(undefined8 *)(pfVar5 + 2) = uStack_48;
      pfVar5 = local_88.m_p[uVar7].m_vec.m_s + 4;
      *(undefined8 *)pfVar5 = local_60;
      *(undefined8 *)(pfVar5 + 2) = uStack_58;
      uVar6 = uVar2 / 2000;
      if (0x7ff < uVar6) {
        uVar6 = 0x800;
      }
      *(undefined8 *)local_88.m_p[uVar7].m_vec.m_s = local_70;
      *(undefined8 *)(local_88.m_p[uVar7].m_vec.m_s + 2) = uStack_68;
      if (uVar2 < 2000) {
        uVar6 = 1;
      }
      local_88.m_p[uVar7].m_weight = uVar6;
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->m_num_blocks);
  }
  bVar1 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                    (&this->m_selector_clusterizer,&local_88,local_8c,local_78,
                     generate_codebook_progress_callback,this);
  if (local_88.m_p != (weighted_vec *)0x0) {
    crnlib_free(local_88.m_p);
  }
  return bVar1;
}

Assistant:

bool qdxt1::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices)
    {
        m_progress_start = m_progress_range;
        m_progress_range = 33;

        weighted_selector_vec_array selector_vecs(m_num_blocks);

        for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++)
        {
            dxt1_block& dxt1_block = get_block(block_iter);

            vec16F sv;
            float* pDst = &sv[0];

            for (uint y = 0; y < 4; y++)
            {
                for (uint x = 0; x < 4; x++)
                {
                    *pDst++ = g_dxt1_to_linear[dxt1_block.get_selector(x, y)];
                }
            }

            const color_quad_u8 first_color(dxt1_block::unpack_color((uint16)dxt1_block.get_low_color(), true));
            const color_quad_u8 second_color(dxt1_block::unpack_color((uint16)dxt1_block.get_high_color(), true));
            const uint dist = color::color_distance(m_params.m_perceptual, first_color, second_color, false);

            const uint cColorDistToWeight = 2000;
            const uint cMaxWeight = 2048;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            selector_vecs[block_iter].m_vec = sv;
            selector_vecs[block_iter].m_weight = weight;
        }

        return m_selector_clusterizer.create_clusters(
            selector_vecs, max_selector_clusters, selector_cluster_indices, generate_codebook_progress_callback, this);
    }